

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::piece_picker::dec_refcount
          (piece_picker *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask,torrent_peer *peer)

{
  piece_pos *this_00;
  prio_index_t elem_index;
  _Head_base<0UL,_unsigned_int_*,_false> _Var1;
  pointer ppVar2;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  piece_pos *m;
  pointer ppVar8;
  uint uVar9;
  ulong uVar10;
  vector<piece_pos,_piece_index_t> *__range2;
  ulong *puVar11;
  torrent_peer *peer_00;
  uint *puVar12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  piece_pos *m_1;
  pointer ppVar16;
  undefined1 *puVar17;
  bool *pbVar18;
  ulong local_38;
  
  puVar11 = &local_38;
  _Var1._M_head_impl =
       *(uint **)&(bitmask->super_bitfield).m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    return;
  }
  uVar9 = *_Var1._M_head_impl;
  if ((ulong)uVar9 == 0) {
    return;
  }
  if ((int)uVar9 < 1) {
    return;
  }
  uVar10 = 0;
  while ((_Var1._M_head_impl + 1)[uVar10] == 0) {
    uVar10 = uVar10 + 1;
    if ((ulong)uVar9 + 0x1f >> 5 == uVar10) {
      return;
    }
  }
  peer_00 = (torrent_peer *)bitmask;
  bVar3 = bitfield::all_set(&bitmask->super_bitfield);
  _Var1._M_head_impl =
       *(uint **)&(bitmask->super_bitfield).m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if (bVar3) {
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = *_Var1._M_head_impl;
    }
    if (uVar9 == (uint)((ulong)((long)(this->m_piece_map).
                                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      .
                                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_piece_map).
                                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     .
                                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      dec_refcount_all(this,peer_00);
      return;
    }
  }
  if (_Var1._M_head_impl != (uint *)0x0) {
    iVar6 = (int)*_Var1._M_head_impl / 2;
    iVar4 = 0x32;
    if (iVar6 < 0x32) {
      iVar4 = iVar6;
    }
    if ((int)*_Var1._M_head_impl < 2) {
      puVar17 = (undefined1 *)0x0;
    }
    else {
      puVar11 = (ulong *)((long)&local_38 - (ulong)(iVar4 * 4 + 0xfU & 0xfffffff0));
      puVar17 = (undefined1 *)puVar11;
    }
    if (this->m_dirty == false) {
      puVar5 = _Var1._M_head_impl + 1;
      if (_Var1._M_head_impl == (uint *)0x0) {
        puVar12 = (uint *)0x0;
        uVar9 = 0x80000000;
        puVar5 = (uint *)0x0;
      }
      else {
        uVar9 = *_Var1._M_head_impl;
        iVar6 = uVar9 + 0x3e;
        if (-1 < (int)(uVar9 + 0x1f)) {
          iVar6 = uVar9 + 0x1f;
        }
        puVar12 = puVar5 + ((long)(iVar6 >> 5) - (ulong)((uVar9 & 0x1f) != 0));
        uVar9 = 0x80000000 >> (sbyte)(uVar9 & 0x1f);
      }
      uVar7 = 0;
      iVar6 = 0;
      uVar10 = 0x80000000;
      do {
        uVar15 = (uint)uVar10;
        if ((*puVar5 &
            (uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18))
            != 0) {
          if ((int)uVar7 < iVar4) {
            *(int *)(puVar17 + (long)(int)uVar7 * 4) = iVar6;
          }
          uVar7 = uVar7 + 1;
          if (iVar4 <= (int)uVar7) break;
        }
        uVar10 = uVar10 >> 1;
        puVar5 = puVar5 + (uVar15 == 1);
        if (uVar15 == 1) {
          uVar10 = 0x80000000;
        }
        iVar6 = iVar6 + 1;
      } while ((puVar5 != puVar12) || ((uint)uVar10 != uVar9));
      if ((int)uVar7 < iVar4) {
        if ((int)uVar7 < 1) {
          return;
        }
        local_38 = (ulong)uVar7;
        uVar10 = 0;
        do {
          this_00 = (this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + *(int *)(puVar17 + uVar10 * 4);
          *(undefined8 *)((long)puVar11 + -8) = 0x287aa5;
          iVar4 = piece_pos::priority(this_00,this);
          uVar9 = *(uint *)this_00;
          if ((uVar9 & 0x3ffffff) == 0) {
            this->m_seeds = this->m_seeds + -1;
            ppVar2 = (this->m_piece_map).
                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     .
                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar8 = (this->m_piece_map).
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          .
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar2;
                ppVar8 = ppVar8 + 1) {
              *(uint *)ppVar8 = *(uint *)ppVar8 & 0xfc000000 | *(uint *)ppVar8 + 1 & 0x3ffffff;
            }
            this->m_dirty = true;
            uVar9 = *(uint *)this_00;
          }
          *(uint *)this_00 = uVar9 & 0xfc000000 | uVar9 - 1 & 0x3ffffff;
          if ((-1 < iVar4) && (this->m_dirty == false)) {
            elem_index.m_val = (this_00->index).m_val;
            *(undefined8 *)((long)puVar11 + -8) = 0x287b10;
            update(this,iVar4,elem_index);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_38);
        return;
      }
    }
    if (_Var1._M_head_impl != (uint *)0x0) {
      uVar9 = *_Var1._M_head_impl;
      iVar4 = uVar9 + 0x3e;
      if (-1 < (int)(uVar9 + 0x1f)) {
        iVar4 = uVar9 + 0x1f;
      }
      puVar5 = _Var1._M_head_impl + 1;
      puVar12 = _Var1._M_head_impl + (iVar4 >> 5) + ((uVar9 & 0x1f) == 0);
      uVar9 = 0x80000000 >> (sbyte)(uVar9 & 0x1f);
      goto LAB_002878c7;
    }
  }
  uVar9 = 0x80000000;
  puVar5 = (uint *)0x0;
  puVar12 = (uint *)0x0;
LAB_002878c7:
  pbVar18 = &this->m_dirty;
  lVar13 = 0;
  bVar14 = 0;
  uVar7 = 0x80000000;
  do {
    if ((*puVar5 & (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
        ) != 0) {
      ppVar8 = (this->m_piece_map).
               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               .
               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = *(uint *)(ppVar8 + lVar13);
      if ((uVar15 & 0x3ffffff) == 0) {
        this->m_seeds = this->m_seeds + -1;
        ppVar2 = (this->m_piece_map).
                 super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                 .
                 super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar16 = ppVar8; ppVar16 != ppVar2; ppVar16 = ppVar16 + 1) {
          *(uint *)ppVar16 = *(uint *)ppVar16 & 0xfc000000 | *(uint *)ppVar16 + 1 & 0x3ffffff;
        }
        *pbVar18 = true;
        uVar15 = *(uint *)(ppVar8 + lVar13);
      }
      *(uint *)(ppVar8 + lVar13) = uVar15 & 0xfc000000 | uVar15 - 1 & 0x3ffffff;
      bVar14 = 1;
    }
    bVar3 = uVar7 == 1;
    puVar5 = puVar5 + bVar3;
    uVar7 = uVar7 >> 1;
    if (bVar3) {
      uVar7 = 0x80000000;
    }
    lVar13 = lVar13 + 1;
  } while ((puVar5 != puVar12) || (uVar7 != uVar9));
  if (((~bVar14 | *pbVar18) & 1) == 0) {
    *pbVar18 = true;
  }
  return;
}

Assistant:

void piece_picker::dec_refcount(typed_bitfield<piece_index_t> const& bitmask
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif
		TORRENT_ASSERT(bitmask.size() <= int(m_piece_map.size()));

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "dec_refcount(bitfield)" << std::endl;
#endif

		// nothing set, nothing to do here
		if (bitmask.none_set()) return;

		if (bitmask.all_set() && bitmask.size() == int(m_piece_map.size()))
		{
			dec_refcount_all(peer);
			return;
		}

		int const size = std::min(50, int(bitmask.size() / 2));

		// this is an optimization where if just a few
		// pieces end up changing, instead of making
		// the piece list dirty, just update those pieces
		// instead
		TORRENT_ALLOCA(decremented, piece_index_t, size);

		if (!m_dirty)
		{
			// first count how many pieces we're updating. If it's few (less than half)
			// we'll just update them one at a time. Otherwise we'll just update the counters
			// and mark the picker as dirty, so we'll rebuild it next time we need it.
			// this only matters if we're not already dirty, in which case the fasted
			// thing to do is to just update the counters and be done
			piece_index_t index{0};
			int num_dec = 0;
			for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
			{
				if (!*i) continue;
				if (num_dec < size) decremented[num_dec] = index;
				++num_dec;
				if (num_dec >= size) break;
			}

			if (num_dec < size)
			{
				// not that many pieces were updated
				// just update those individually instead of
				// rebuilding the whole piece list
				for (int i = 0; i < num_dec; ++i)
				{
					piece_index_t const piece = decremented[i];
					piece_pos& p = m_piece_map[piece];
					int prev_priority = p.priority(this);

					if (p.peer_count == 0)
					{
						TORRENT_ASSERT(m_seeds > 0);
						// this is the case where we have one or more
						// seeds, and one of them saying: I don't have this
						// piece anymore. we need to break up one of the seed
						// counters into actual peer counters on the pieces
						break_one_seed();
					}

#ifdef TORRENT_DEBUG_REFCOUNTS
					TORRENT_ASSERT(p.have_peers.count(peer) == 1);
					p.have_peers.erase(peer);
#else
					TORRENT_UNUSED(peer);
#endif
					TORRENT_ASSERT(p.peer_count > 0);
					--p.peer_count;
					if (!m_dirty && prev_priority >= 0) update(prev_priority, p.index);
				}
				return;
			}
		}

		piece_index_t index{0};
		bool updated = false;
		for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
		{
			if (*i)
			{
				piece_pos& p = m_piece_map[index];
				if (p.peer_count == 0)
				{
					TORRENT_ASSERT(m_seeds > 0);
					// this is the case where we have one or more
					// seeds, and one of them saying: I don't have this
					// piece anymore. we need to break up one of the seed
					// counters into actual peer counters on the pieces
					break_one_seed();
				}

#ifdef TORRENT_DEBUG_REFCOUNTS
				TORRENT_ASSERT(p.have_peers.count(peer) == 1);
				p.have_peers.erase(peer);
#else
				TORRENT_UNUSED(peer);
#endif

				TORRENT_ASSERT(p.peer_count > 0);
				--p.peer_count;
				updated = true;
			}
		}

		// if we're already dirty, no point in doing anything more
		if (m_dirty) return;

		if (updated) m_dirty = true;
	}